

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONConfigurePresets.cxx
# Opt level: O0

ReadFileResult
anon_unknown.dwarf_890bae::VariableHelper
          (optional<cmCMakePresetsGraph::CacheVariable> *out,Value *value)

{
  bool bVar1;
  char *__s;
  CacheVariable *out_00;
  allocator<char> local_b9;
  CacheVariable local_b8;
  undefined1 local_76;
  allocator<char> local_75 [20];
  allocator<char> local_61;
  CacheVariable local_60;
  Value *local_20;
  Value *value_local;
  optional<cmCMakePresetsGraph::CacheVariable> *out_local;
  
  local_20 = value;
  value_local = (Value *)out;
  bVar1 = Json::Value::isBool(value);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"BOOL",&local_61);
    local_76 = 1;
    bVar1 = Json::Value::asBool(local_20);
    __s = "FALSE";
    if (bVar1) {
      __s = "TRUE";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60.Value,__s,local_75);
    local_76 = 0;
    std::optional<cmCMakePresetsGraph::CacheVariable>::operator=
              ((optional<cmCMakePresetsGraph::CacheVariable> *)value_local,&local_60);
    cmCMakePresetsGraph::CacheVariable::~CacheVariable(&local_60);
    std::allocator<char>::~allocator(local_75);
    std::allocator<char>::~allocator(&local_61);
    out_local._4_4_ = READ_OK;
  }
  else {
    bVar1 = Json::Value::isString(local_20);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"",&local_b9);
      Json::Value::asString_abi_cxx11_(&local_b8.Value,local_20);
      std::optional<cmCMakePresetsGraph::CacheVariable>::operator=
                ((optional<cmCMakePresetsGraph::CacheVariable> *)value_local,&local_b8);
      cmCMakePresetsGraph::CacheVariable::~CacheVariable(&local_b8);
      std::allocator<char>::~allocator(&local_b9);
      out_local._4_4_ = READ_OK;
    }
    else {
      bVar1 = Json::Value::isObject(local_20);
      if (bVar1) {
        std::optional<cmCMakePresetsGraph::CacheVariable>::emplace<>
                  ((optional<cmCMakePresetsGraph::CacheVariable> *)value_local);
        out_00 = std::optional<cmCMakePresetsGraph::CacheVariable>::operator*
                           ((optional<cmCMakePresetsGraph::CacheVariable> *)value_local);
        out_local._4_4_ =
             cmJSONHelperBuilder<cmCMakePresetsGraph::ReadFileResult>::
             Object<cmCMakePresetsGraph::CacheVariable>::operator()
                       ((Object<cmCMakePresetsGraph::CacheVariable> *)
                        (anonymous_namespace)::VariableObjectHelper,out_00,local_20);
      }
      else {
        bVar1 = Json::Value::isNull(local_20);
        if (bVar1) {
          std::optional<cmCMakePresetsGraph::CacheVariable>::operator=
                    ((optional<cmCMakePresetsGraph::CacheVariable> *)value_local);
          out_local._4_4_ = READ_OK;
        }
        else {
          out_local._4_4_ = INVALID_VARIABLE;
        }
      }
    }
  }
  return out_local._4_4_;
}

Assistant:

ReadFileResult VariableHelper(cm::optional<CacheVariable>& out,
                              const Json::Value* value)
{
  if (value->isBool()) {
    out = CacheVariable{
      /*Type=*/"BOOL",
      /*Value=*/value->asBool() ? "TRUE" : "FALSE",
    };
    return ReadFileResult::READ_OK;
  }
  if (value->isString()) {
    out = CacheVariable{
      /*Type=*/"",
      /*Value=*/value->asString(),
    };
    return ReadFileResult::READ_OK;
  }
  if (value->isObject()) {
    out.emplace();
    return VariableObjectHelper(*out, value);
  }
  if (value->isNull()) {
    out = cm::nullopt;
    return ReadFileResult::READ_OK;
  }
  return ReadFileResult::INVALID_VARIABLE;
}